

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int read_chars(lua_State *L,FILE *f,size_t n)

{
  char *__ptr;
  size_t sVar1;
  size_t sVar2;
  ulong in_RDX;
  FILE *in_RSI;
  lua_State *in_RDI;
  char *p;
  luaL_Buffer b;
  size_t nr;
  size_t rlen;
  bool local_204a;
  bool local_2049;
  char *in_stack_ffffffffffffdfc0;
  lua_State *in_stack_ffffffffffffdfc8;
  ulong local_20;
  ulong local_18;
  
  luaL_buffinit(in_RDI,(luaL_Buffer *)&stack0xffffffffffffdfc0);
  local_20 = 0x2000;
  local_18 = in_RDX;
  do {
    __ptr = luaL_prepbuffer((luaL_Buffer *)0x11cf97);
    if (local_18 < local_20) {
      local_20 = local_18;
    }
    sVar1 = fread(__ptr,1,local_20,in_RSI);
    in_stack_ffffffffffffdfc0 = in_stack_ffffffffffffdfc0 + sVar1;
    local_18 = local_18 - sVar1;
    local_2049 = local_18 != 0 && sVar1 == local_20;
  } while (local_2049);
  luaL_pushresult((luaL_Buffer *)0x11d050);
  local_204a = true;
  if (local_18 != 0) {
    sVar2 = lua_objlen(in_stack_ffffffffffffdfc8,(int)((ulong)in_stack_ffffffffffffdfc0 >> 0x20));
    local_204a = sVar2 != 0;
  }
  return (int)local_204a;
}

Assistant:

static int read_chars(lua_State*L,FILE*f,size_t n){
size_t rlen;
size_t nr;
luaL_Buffer b;
luaL_buffinit(L,&b);
rlen=BUFSIZ;
do{
char*p=luaL_prepbuffer(&b);
if(rlen>n)rlen=n;
nr=fread(p,sizeof(char),rlen,f);
luaL_addsize(&b,nr);
n-=nr;
}while(n>0&&nr==rlen);
luaL_pushresult(&b);
return(n==0||lua_objlen(L,-1)>0);
}